

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_key.cpp
# Opt level: O0

int CfdCheckTweakAddFromSchnorrPubkey
              (void *handle,char *tweaked_pubkey,bool tweaked_parity,char *base_pubkey,char *tweak)

{
  bool bVar1;
  undefined8 uVar2;
  char *in_RCX;
  byte in_DL;
  char *in_RSI;
  char *in_R8;
  CfdException *except;
  exception *std_except;
  bool is_tweaked;
  SchnorrPubkey base_pubkey_obj;
  SchnorrPubkey pubkey_obj;
  ByteData256 tweak_obj;
  int result;
  string *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffdb8;
  CfdError error_code;
  allocator *paVar3;
  CfdException *in_stack_fffffffffffffdc0;
  allocator local_1c1;
  string local_1c0;
  SchnorrPubkey local_1a0;
  allocator local_181;
  string local_180;
  SchnorrPubkey local_160;
  allocator local_141;
  string local_140;
  ByteData256 local_120;
  undefined1 local_102;
  allocator local_101;
  string local_100 [32];
  CfdSourceLocation local_e0;
  undefined1 local_c2;
  allocator local_c1;
  string local_c0 [32];
  CfdSourceLocation local_a0;
  undefined1 local_82;
  allocator local_81;
  string local_80 [32];
  CfdSourceLocation local_60;
  undefined4 local_34;
  char *local_30;
  char *local_28;
  byte local_19;
  char *local_18;
  int local_4;
  
  error_code = (CfdError)((ulong)in_stack_fffffffffffffdb8 >> 0x20);
  local_19 = in_DL & 1;
  local_34 = 0xffffffff;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_RSI;
  cfd::Initialize();
  bVar1 = cfd::capi::IsEmptyString(local_18);
  if (bVar1) {
    local_60.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_60.filename = local_60.filename + 1;
    local_60.line = 0x23f;
    local_60.funcname = "CfdCheckTweakAddFromSchnorrPubkey";
    cfd::core::logger::warn<>(&local_60,"tweak pubkey is null or empty.");
    local_82 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_80,"Failed to parameter. tweak pubkey is null or empty.",&local_81);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
    local_82 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  bVar1 = cfd::capi::IsEmptyString(local_28);
  if (!bVar1) {
    bVar1 = cfd::capi::IsEmptyString(local_30);
    if (!bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_140,local_30,&local_141);
      cfd::core::ByteData256::ByteData256(&local_120,&local_140);
      std::__cxx11::string::~string((string *)&local_140);
      std::allocator<char>::~allocator((allocator<char> *)&local_141);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_180,local_18,&local_181);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&local_160,&local_180);
      std::__cxx11::string::~string((string *)&local_180);
      std::allocator<char>::~allocator((allocator<char> *)&local_181);
      paVar3 = &local_1c1;
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_1c0,local_28,paVar3);
      cfd::core::SchnorrPubkey::SchnorrPubkey(&local_1a0,&local_1c0);
      std::__cxx11::string::~string((string *)&local_1c0);
      std::allocator<char>::~allocator((allocator<char> *)&local_1c1);
      bVar1 = cfd::core::SchnorrPubkey::IsTweaked
                        (&local_160,&local_1a0,&local_120,(bool)(local_19 & 1));
      if (bVar1) {
        local_4 = 0;
      }
      else {
        local_4 = 7;
      }
      cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5d00ed);
      cfd::core::SchnorrPubkey::~SchnorrPubkey((SchnorrPubkey *)0x5d00fa);
      cfd::core::ByteData256::~ByteData256((ByteData256 *)0x5d0107);
      return local_4;
    }
    local_e0.filename =
         strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
                 ,0x2f);
    local_e0.filename = local_e0.filename + 1;
    local_e0.line = 0x24b;
    local_e0.funcname = "CfdCheckTweakAddFromSchnorrPubkey";
    cfd::core::logger::warn<>(&local_e0,"tweak is null or empty.");
    local_102 = 1;
    uVar2 = __cxa_allocate_exception(0x30);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_100,"Failed to parameter. tweak is null or empty.",&local_101);
    cfd::core::CfdException::CfdException
              (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
    local_102 = 0;
    __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
  }
  local_a0.filename =
       strrchr("//workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/src/capi/cfdcapi_key.cpp"
               ,0x2f);
  local_a0.filename = local_a0.filename + 1;
  local_a0.line = 0x245;
  local_a0.funcname = "CfdCheckTweakAddFromSchnorrPubkey";
  cfd::core::logger::warn<>(&local_a0,"pubkey is null or empty.");
  local_c2 = 1;
  uVar2 = __cxa_allocate_exception(0x30);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_c0,"Failed to parameter. pubkey is null or empty.",&local_c1);
  cfd::core::CfdException::CfdException
            (in_stack_fffffffffffffdc0,error_code,in_stack_fffffffffffffdb0);
  local_c2 = 0;
  __cxa_throw(uVar2,&cfd::core::CfdException::typeinfo,cfd::core::CfdException::~CfdException);
}

Assistant:

int CfdCheckTweakAddFromSchnorrPubkey(
    void* handle, const char* tweaked_pubkey, bool tweaked_parity,
    const char* base_pubkey, const char* tweak) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    if (IsEmptyString(tweaked_pubkey)) {
      warn(CFD_LOG_SOURCE, "tweak pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak pubkey is null or empty.");
    }
    if (IsEmptyString(base_pubkey)) {
      warn(CFD_LOG_SOURCE, "pubkey is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. pubkey is null or empty.");
    }
    if (IsEmptyString(tweak)) {
      warn(CFD_LOG_SOURCE, "tweak is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. tweak is null or empty.");
    }

    ByteData256 tweak_obj = ByteData256(std::string(tweak));
    SchnorrPubkey pubkey_obj = SchnorrPubkey(std::string(tweaked_pubkey));
    SchnorrPubkey base_pubkey_obj = SchnorrPubkey(std::string(base_pubkey));
    bool is_tweaked =
        pubkey_obj.IsTweaked(base_pubkey_obj, tweak_obj, tweaked_parity);
    if (!is_tweaked) {
      return CfdErrorCode::kCfdSignVerificationError;
    }

    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}